

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

char * fread_line(FILE *stream,size_t *out_len)

{
  char *pcVar1;
  long lVar2;
  size_t cur;
  size_t len;
  char buf [128];
  char *outptr;
  char *output;
  size_t *out_len_local;
  FILE *stream_local;
  
  buf[0x78] = '\0';
  buf[0x79] = '\0';
  buf[0x7a] = '\0';
  buf[0x7b] = '\0';
  buf[0x7c] = '\0';
  buf[0x7d] = '\0';
  buf[0x7e] = '\0';
  buf[0x7f] = '\0';
  outptr = (char *)0x0;
  while (pcVar1 = fgets((char *)&len,0x80,(FILE *)stream), pcVar1 != (char *)0x0) {
    cur = strlen((char *)&len);
    if (outptr == (char *)0x0) {
      buf._120_8_ = __ckd_malloc__(cur + 1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                   ,0x184);
      outptr = (char *)buf._120_8_;
    }
    else {
      lVar2 = buf._120_8_ - (long)outptr;
      outptr = (char *)__ckd_realloc__(outptr,lVar2 + cur + 1,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                       ,0x189);
      buf._120_8_ = outptr + lVar2;
    }
    memcpy((void *)buf._120_8_,&len,cur + 1);
    buf._120_8_ = cur + buf._120_8_;
    if ((cur < 0x7f) || (*(char *)((long)&cur + cur + 7) == '\n')) break;
  }
  if (out_len != (size_t *)0x0) {
    *out_len = buf._120_8_ - (long)outptr;
  }
  return outptr;
}

Assistant:

char *
fread_line(FILE *stream, size_t *out_len)
{
    char *output, *outptr;
    char buf[128];

    output = outptr = NULL;
    while (fgets(buf, sizeof(buf), stream)) {
        size_t len = strlen(buf);
        /* Append this data to the buffer. */
        if (output == NULL) {
            output = (char *)ckd_malloc(len + 1);
            outptr = output;
        }
        else {
            size_t cur = outptr - output;
            output = (char *)ckd_realloc(output, cur + len + 1);
            outptr = output + cur;
        }
        memcpy(outptr, buf, len + 1);
        outptr += len;
        /* Stop on a short read or end of line. */
        if (len < sizeof(buf)-1 || buf[len-1] == '\n')
            break;
    }
    if (out_len) *out_len = outptr - output;
    return output;
}